

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_snap.c
# Opt level: O0

void snap_unsink(jit_State *J,GCtrace *T,ExitState *ex,SnapNo snapno,BloomFilter rfilt,IRIns *ir,
                TValue *o)

{
  IRIns *pIVar1;
  IRIns *pIVar2;
  TValue *o_00;
  long lVar3;
  IRIns *local_1e0;
  TValue *val;
  TValue tmp;
  IRIns *irk;
  GCtab *t;
  IRIns *irlast_1;
  IRIns *irs_1;
  uint8_t *puStack_1a0;
  CTSize szs;
  uint8_t *p_1;
  IRIns *iro;
  IRIns *irlast;
  IRIns *irs;
  uint8_t *p;
  GCcdata *cd;
  CTSize local_168;
  CTInfo info;
  CTSize sz;
  CTypeID id;
  CTState *cts;
  IRIns *ir_local;
  BloomFilter rfilt_local;
  ExitState *pEStack_140;
  SnapNo snapno_local;
  ExitState *ex_local;
  GCtrace *T_local;
  jit_State *J_local;
  CTState *local_120;
  ExitState *local_118;
  uint local_10c;
  IRIns *local_108;
  CTState *local_100;
  ExitState *local_f8;
  uint local_ec;
  CTState *local_e8;
  CTState *cts_1;
  GCcdata *local_d8;
  TValue *local_d0;
  undefined8 local_c8;
  IRIns *local_c0;
  TValue *local_b8;
  undefined8 local_b0;
  undefined4 local_a4;
  IRIns *local_a0;
  TValue *local_98;
  undefined8 local_90;
  char *local_88;
  TValue *local_80;
  undefined8 local_78;
  undefined4 local_6c;
  GCcdata *local_68;
  TValue *local_60;
  undefined8 local_58;
  char *local_50;
  TValue *local_48;
  undefined8 local_40;
  undefined4 local_34;
  GCcdata *local_30;
  TValue *local_28;
  undefined4 local_1c;
  IRIns *local_18;
  TValue *local_10;
  
  cts = (CTState *)ir;
  ir_local = (IRIns *)rfilt;
  rfilt_local._4_4_ = snapno;
  pEStack_140 = ex;
  ex_local = (ExitState *)T;
  T_local = &J->cur;
  if (((ir->field_1).o == 'S') || ((ir->field_1).o == 'T')) {
    cts_1 = (CTState *)J->L;
    _sz = *(CTState **)(((MRef *)&cts_1->L)->ptr64 + 0x180);
    _sz->L = (lua_State *)cts_1;
    info = T->ir[(ir->field_0).op1].field_1.op12;
    local_e8 = _sz;
    cd._4_4_ = lj_ctype_info(_sz,info,&local_168);
    p = (uint8_t *)lj_cdata_newx(_sz,info,local_168,cd._4_4_);
    local_c8._0_1_ = T_local[1].marked;
    local_c8._1_1_ = T_local[1].gct;
    local_c8._2_2_ = T_local[1].nsnap;
    local_c8._4_4_ = T_local[1].nins;
    local_d0 = o;
    local_60 = o;
    local_6c = 0xfffffff5;
    local_28 = o;
    local_34 = 0xfffffff5;
    o->u64 = (ulong)p | 0xfffa800000000000;
    local_48 = o;
    local_50 = "store to dead GC object";
    local_d8 = (GCcdata *)p;
    local_68 = (GCcdata *)p;
    local_58 = local_c8;
    local_40 = local_c8;
    local_30 = (GCcdata *)p;
    if (*(char *)((long)&cts->tab + 5) == 'T') {
      irs = (IRIns *)((long)p + 0x10);
      snap_restoredata((jit_State *)T_local,(GCtrace *)ex_local,pEStack_140,rfilt_local._4_4_,
                       (BloomFilter)ir_local,(uint)*(ushort *)((long)&cts->tab + 2),irs,local_168);
    }
    else {
      iro = (IRIns *)((long)ex_local->fpr[4] +
                     (ulong)*(ushort *)((long)ex_local->fpr[6] + (ulong)rfilt_local._4_4_ * 0xc + 4)
                     * 8);
      pIVar2 = (IRIns *)cts;
      while (pIVar1 = pIVar2, irlast = pIVar1 + 1, irlast < iro) {
        pIVar2 = irlast;
        if (*(char *)((long)pIVar1 + 0xe) == -2) {
          local_f8 = ex_local;
          local_100 = cts;
          local_108 = irlast;
          if (*(char *)((long)pIVar1 + 0xf) == -1) {
            local_ec = snap_sunk_store2((GCtrace *)ex_local,(IRIns *)cts,irlast);
          }
          else {
            local_ec = (uint)((IRIns *)((cts->cb).fpr +
                                       (long)(int)(uint)*(byte *)((long)pIVar1 + 0xf) + -6) ==
                             irlast);
          }
          pIVar2 = irlast;
          if (local_ec != 0) {
            p_1 = (uint8_t *)
                  ((long)ex_local->fpr[4] +
                  (ulong)*(ushort *)((long)ex_local->fpr[4] + 2 + (ulong)(irlast->field_0).op1 * 8)
                  * 8);
            if ((0x605fd9U >> ((irlast->field_1).t.irt & 0x1f) & 1) == 0) {
              if ((((irlast->field_1).t.irt & 0x1f) == 0xf) ||
                 (((irlast->field_1).t.irt & 0x1f) == 0x10)) {
                irs_1._4_4_ = 1;
              }
              else if ((((irlast->field_1).t.irt & 0x1f) == 0x11) ||
                      (((irlast->field_1).t.irt & 0x1f) == 0x12)) {
                irs_1._4_4_ = 2;
              }
              else {
                irs_1._4_4_ = 4;
              }
            }
            else {
              irs_1._4_4_ = 8;
            }
            if (*(char *)((long)p_1 + 5) == '\x1d') {
              lVar3 = *(long *)((long)p_1 + 8);
            }
            else {
              lVar3 = (long)*(int *)p_1;
            }
            puStack_1a0 = p + lVar3;
            snap_restoredata((jit_State *)T_local,(GCtrace *)ex_local,pEStack_140,rfilt_local._4_4_,
                             (BloomFilter)ir_local,(uint)(irlast->field_0).op2,puStack_1a0,
                             irs_1._4_4_);
            pIVar2 = irlast;
          }
        }
      }
    }
  }
  else {
    if ((ir->field_1).o == 'Q') {
      local_1e0 = (IRIns *)lj_tab_new(J->L,(uint)(ir->field_0).op1,(uint)(ir->field_0).op2);
    }
    else {
      local_1e0 = (IRIns *)lj_tab_dup(J->L,(GCtab *)T->ir[(ulong)(ir->field_0).op1 + 1]);
    }
    irk = local_1e0;
    local_b0._0_1_ = T_local[1].marked;
    local_b0._1_1_ = T_local[1].gct;
    local_b0._2_2_ = T_local[1].nsnap;
    local_b0._4_4_ = T_local[1].nins;
    local_b8 = o;
    local_c0 = local_1e0;
    local_98 = o;
    local_a0 = local_1e0;
    local_a4 = 0xfffffff4;
    local_10 = o;
    local_18 = local_1e0;
    local_1c = 0xfffffff4;
    o->u64 = (ulong)local_1e0 | 0xfffa000000000000;
    local_80 = o;
    local_88 = "store to dead GC object";
    t = (GCtab *)((long)ex_local->fpr[4] +
                 (ulong)*(ushort *)((long)ex_local->fpr[6] + (ulong)rfilt_local._4_4_ * 0xc + 4) * 8
                 );
    local_90 = local_b0;
    local_78 = local_b0;
    pIVar2 = (IRIns *)cts;
    while (pIVar1 = pIVar2, irlast_1 = pIVar1 + 1, irlast_1 < t) {
      pIVar2 = irlast_1;
      if (*(char *)((long)pIVar1 + 0xe) == -2) {
        local_118 = ex_local;
        local_120 = cts;
        J_local = (jit_State *)&irlast_1->field_0;
        if (*(char *)((long)pIVar1 + 0xf) == -1) {
          local_10c = snap_sunk_store2((GCtrace *)ex_local,(IRIns *)cts,irlast_1);
        }
        else {
          local_10c = (uint)((IRIns *)((cts->cb).fpr +
                                      (long)(int)(uint)*(byte *)((long)pIVar1 + 0xf) + -6) ==
                            irlast_1);
        }
        pIVar2 = irlast_1;
        if (local_10c != 0) {
          tmp.n = ex_local->fpr[4] + (ulong)(irlast_1->field_0).op1 * 8;
          if (*(char *)(tmp.u64 + 5) == '>') {
            snap_restoreval((jit_State *)T_local,(GCtrace *)ex_local,pEStack_140,rfilt_local._4_4_,
                            (BloomFilter)ir_local,(uint)(irlast_1->field_0).op2,(TValue *)&val);
            irk[4] = (IRIns)((ulong)val & 0x7fffffffffff);
            pIVar2 = irlast_1;
          }
          else {
            tmp.n = ex_local->fpr[4] + (ulong)*(ushort *)(tmp.u64 + 2) * 8;
            if (*(char *)(tmp.u64 + 5) == '\x1e') {
              tmp.n = ex_local->fpr[4] + (ulong)*(ushort *)tmp * 8;
            }
            lj_ir_kvalue(*(lua_State **)&T_local[1].marked,(TValue *)&val,(IRIns *)tmp);
            o_00 = lj_tab_set(*(lua_State **)&T_local[1].marked,(GCtab *)&irk->field_0,
                              (cTValue *)&val);
            snap_restoreval((jit_State *)T_local,(GCtrace *)ex_local,pEStack_140,rfilt_local._4_4_,
                            (BloomFilter)ir_local,(uint)(irlast_1->field_0).op2,o_00);
            pIVar2 = irlast_1;
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void snap_unsink(jit_State *J, GCtrace *T, ExitState *ex,
			SnapNo snapno, BloomFilter rfilt,
			IRIns *ir, TValue *o)
{
  lj_assertJ(ir->o == IR_TNEW || ir->o == IR_TDUP ||
	     ir->o == IR_CNEW || ir->o == IR_CNEWI,
	     "sunk allocation with bad op %d", ir->o);
#if LJ_HASFFI
  if (ir->o == IR_CNEW || ir->o == IR_CNEWI) {
    CTState *cts = ctype_cts(J->L);
    CTypeID id = (CTypeID)T->ir[ir->op1].i;
    CTSize sz;
    CTInfo info = lj_ctype_info(cts, id, &sz);
    GCcdata *cd = lj_cdata_newx(cts, id, sz, info);
    setcdataV(J->L, o, cd);
    if (ir->o == IR_CNEWI) {
      uint8_t *p = (uint8_t *)cdataptr(cd);
      lj_assertJ(sz == 4 || sz == 8, "sunk cdata with bad size %d", sz);
      if (LJ_32 && sz == 8 && ir+1 < T->ir + T->nins && (ir+1)->o == IR_HIOP) {
	snap_restoredata(J, T, ex, snapno, rfilt, (ir+1)->op2,
			 LJ_LE ? p+4 : p, 4);
	if (LJ_BE) p += 4;
	sz = 4;
      }
      snap_restoredata(J, T, ex, snapno, rfilt, ir->op2, p, sz);
    } else {
      IRIns *irs, *irlast = &T->ir[T->snap[snapno].ref];
      for (irs = ir+1; irs < irlast; irs++)
	if (irs->r == RID_SINK && snap_sunk_store(T, ir, irs)) {
	  IRIns *iro = &T->ir[T->ir[irs->op1].op2];
	  uint8_t *p = (uint8_t *)cd;
	  CTSize szs;
	  lj_assertJ(irs->o == IR_XSTORE, "sunk store with bad op %d", irs->o);
	  lj_assertJ(T->ir[irs->op1].o == IR_ADD,
		     "sunk store with bad add op %d", T->ir[irs->op1].o);
	  lj_assertJ(iro->o == IR_KINT || iro->o == IR_KINT64,
		     "sunk store with bad const offset op %d", iro->o);
	  if (irt_is64(irs->t)) szs = 8;
	  else if (irt_isi8(irs->t) || irt_isu8(irs->t)) szs = 1;
	  else if (irt_isi16(irs->t) || irt_isu16(irs->t)) szs = 2;
	  else szs = 4;
	  if (LJ_64 && iro->o == IR_KINT64)
	    p += (int64_t)ir_k64(iro)->u64;
	  else
	    p += iro->i;
	  lj_assertJ(p >= (uint8_t *)cdataptr(cd) &&
		     p + szs <= (uint8_t *)cdataptr(cd) + sz,
		     "sunk store with offset out of range");
	  if (LJ_32 && irs+1 < T->ir + T->nins && (irs+1)->o == IR_HIOP) {
	    lj_assertJ(szs == 4, "sunk store with bad size %d", szs);
	    snap_restoredata(J, T, ex, snapno, rfilt, (irs+1)->op2,
			     LJ_LE ? p+4 : p, 4);
	    if (LJ_BE) p += 4;
	  }
	  snap_restoredata(J, T, ex, snapno, rfilt, irs->op2, p, szs);
	}
    }
  } else
#endif
  {
    IRIns *irs, *irlast;
    GCtab *t = ir->o == IR_TNEW ? lj_tab_new(J->L, ir->op1, ir->op2) :
				  lj_tab_dup(J->L, ir_ktab(&T->ir[ir->op1]));
    settabV(J->L, o, t);
    irlast = &T->ir[T->snap[snapno].ref];
    for (irs = ir+1; irs < irlast; irs++)
      if (irs->r == RID_SINK && snap_sunk_store(T, ir, irs)) {
	IRIns *irk = &T->ir[irs->op1];
	TValue tmp, *val;
	lj_assertJ(irs->o == IR_ASTORE || irs->o == IR_HSTORE ||
		   irs->o == IR_FSTORE,
		   "sunk store with bad op %d", irs->o);
	if (irk->o == IR_FREF) {
	  lj_assertJ(irk->op2 == IRFL_TAB_META,
		     "sunk store with bad field %d", irk->op2);
	  snap_restoreval(J, T, ex, snapno, rfilt, irs->op2, &tmp);
	  /* NOBARRIER: The table is new (marked white). */
	  setgcref(t->metatable, obj2gco(tabV(&tmp)));
	} else {
	  irk = &T->ir[irk->op2];
	  if (irk->o == IR_KSLOT) irk = &T->ir[irk->op1];
	  lj_ir_kvalue(J->L, &tmp, irk);
	  val = lj_tab_set(J->L, t, &tmp);
	  /* NOBARRIER: The table is new (marked white). */
	  snap_restoreval(J, T, ex, snapno, rfilt, irs->op2, val);
	  if (LJ_SOFTFP32 && irs+1 < T->ir + T->nins && (irs+1)->o == IR_HIOP) {
	    snap_restoreval(J, T, ex, snapno, rfilt, (irs+1)->op2, &tmp);
	    val->u32.hi = tmp.u32.lo;
	  }
	}
      }
  }
}